

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_STLEXD_a32(DisasContext_conflict1 *s,arg_STREX *a)

{
  uint64_t uVar1;
  
  uVar1 = s->features;
  if (((uint)uVar1 >> 0x1b & 1) != 0) {
    if ((a->rt & 1U) == 0) {
      a->rt2 = a->rt | 1;
      op_strex(s,a,MO_64,true);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return (_Bool)((byte)(uVar1 >> 0x18) >> 3 & 1);
}

Assistant:

static bool trans_STLEXD_a32(DisasContext *s, arg_STREX *a)
{
    if (!ENABLE_ARCH_8) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    a->rt2 = a->rt + 1;
    return op_strex(s, a, MO_64, true);
}